

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_main_oj.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  int iVar1;
  vector<int,_std::allocator<int>_> *local_1a8;
  allocator<std::vector<int,_std::allocator<int>_>_> local_15b;
  undefined1 local_15a;
  allocator<int> local_159;
  int local_158 [4];
  iterator local_148;
  size_type local_140;
  allocator<int> local_131;
  int local_130 [4];
  iterator local_120;
  size_type local_118;
  allocator<int> local_109;
  int local_108 [4];
  iterator local_f8;
  size_type local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  g;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> nums1;
  Solution s;
  
  nums1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_58[4] = 1;
  local_58[5] = 2;
  local_58[6] = 6;
  local_58[0] = 1;
  local_58[1] = 3;
  local_58[2] = 4;
  local_58[3] = 7;
  local_38 = local_58;
  local_30 = 7;
  std::allocator<int>::allocator(&local_59);
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_03,&local_59);
  std::allocator<int>::~allocator(&local_59);
  local_15a = 1;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_f8 = local_108;
  local_f0 = 4;
  local_e8 = &local_e0;
  std::allocator<int>::allocator(&local_109);
  __l_01._M_len = local_f0;
  __l_01._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_01,&local_109);
  local_130[0] = 0;
  local_130[1] = 1;
  local_130[2] = 2;
  local_130[3] = 0;
  local_120 = local_130;
  local_118 = 4;
  local_e8 = &local_c8;
  std::allocator<int>::allocator(&local_131);
  __l_00._M_len = local_118;
  __l_00._M_array = local_120;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_00,&local_131);
  local_158[0] = 0;
  local_158[1] = 2;
  local_158[2] = 0;
  local_158[3] = 0;
  local_148 = local_158;
  local_140 = 4;
  local_e8 = &local_b0;
  std::allocator<int>::allocator(&local_159);
  __l._M_len = local_140;
  __l._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l,&local_159);
  local_15a = 0;
  local_98._0_8_ = &local_e0;
  local_98._8_8_ = (pointer)0x3;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_15b);
  __l_02._M_len = local_98._8_8_;
  __l_02._M_array = (iterator)local_98._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_98 + 0x10),__l_02,&local_15b);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_15b);
  local_1a8 = (vector<int,_std::allocator<int>_> *)local_98;
  do {
    local_1a8 = local_1a8 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1a8);
  } while (local_1a8 != &local_e0);
  std::allocator<int>::~allocator(&local_159);
  std::allocator<int>::~allocator(&local_131);
  std::allocator<int>::~allocator(&local_109);
  iVar1 = Solution::maximumMinutes
                    ((Solution *)
                     ((long)&nums1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 3),
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_98 + 0x10));
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  nums1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_98 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return nums1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
    Solution s;
    vector<int> nums1 = {1,3,4,7,1,2,6};
//    vector<vector<int>> g = {{0,2,0,0,0,0,0},{0,0,0,2,2,1,0},{0,2,0,0,1,2,0},{0,0,2,2,2,0,2},{0,0,0,0,0,0,0}};
    vector<vector<int>> g = {{0,0,0,0},{0,1,2,0},{0,2,0,0}};
//    vector<vector<int>> g = {{0,0,0},{2,2,0},{1,2,0}};
    cout << (s.maximumMinutes(g));
    return 0;
}